

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void apply_to_each(dill_stream c,void *insns,virtual_mach_info vmi,apply_func func)

{
  ulong *puVar1;
  code *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  basic_block_conflict bb;
  size_t j;
  size_t i;
  ulong local_30;
  ulong local_28;
  
  for (local_28 = 0; local_28 < (ulong)(long)*(int *)(in_RDX + 8); local_28 = local_28 + 1) {
    puVar1 = (ulong *)(*(long *)(in_RDX + 0x10) + local_28 * 0x68);
    for (local_30 = *puVar1; local_30 <= puVar1[1]; local_30 = local_30 + 1) {
      (*in_RCX)(in_RDI,puVar1,in_RSI,local_30);
    }
  }
  return;
}

Assistant:

static void
apply_to_each(dill_stream c,
              void* insns,
              virtual_mach_info vmi,
              apply_func func)
{
    size_t i, j = 0;

    for (i = 0; i < vmi->bbcount; i++) {
        basic_block bb = &vmi->bblist[i];
        for (j = (size_t)bb->start; j <= (size_t)bb->end; j++) {
            (func)(c, bb, insns, (int)j);
        }
    }
}